

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

void __thiscall
testing::internal::
FlatTupleBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_>
::~FlatTupleBase(FlatTupleBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_>
                 *this)

{
  FlatTupleBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_>
  *this_local;
  
  FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_5UL>
  ::~FlatTupleElemBase
            (&this->
              super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_5UL>
            );
  FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_4UL>
  ::~FlatTupleElemBase
            (&this->
              super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_4UL>
            );
  FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_3UL>
  ::~FlatTupleElemBase
            (&this->
              super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_3UL>
            );
  FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_2UL>
  ::~FlatTupleElemBase
            (&this->
              super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_2UL>
            );
  FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_1UL>
  ::~FlatTupleElemBase
            (&this->
              super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_1UL>
            );
  FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_0UL>
  ::~FlatTupleElemBase
            (&this->
              super_FlatTupleElemBase<testing::internal::FlatTuple<google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam,_google::protobuf::descriptor_unittest::HasHasbitTestParam>,_0UL>
            );
  return;
}

Assistant:

FlatTupleBase() = default;